

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

target_ulong helper_inw_x86_64(CPUX86State *env,uint32_t port)

{
  uint16_t uVar1;
  uint32_t port_local;
  CPUX86State *env_local;
  
  uVar1 = cpu_inw_x86_64(env->uc,port);
  return (ulong)uVar1;
}

Assistant:

target_ulong helper_inw(CPUX86State *env, uint32_t port)
{
// #ifdef UNICORN_ARCH_POSTFIX
//     return glue(address_space_lduw, UNICORN_ARCH_POSTFIX)(env->uc, &env->uc->address_space_io, port,
// #else
//     return address_space_lduw(env->uc, &env->uc->address_space_io, port,
// #endif
//                               cpu_get_mem_attrs(env), NULL);
    return cpu_inw(env->uc, port);
}